

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O3

string * __thiscall
cmCustomCommandGenerator::GetFullDepfile_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this)

{
  bool bVar1;
  string *psVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string depfile;
  string local_d8;
  string local_b8;
  undefined8 local_98;
  undefined8 local_90;
  undefined1 *local_88;
  undefined1 local_80 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  undefined8 local_48;
  undefined1 *local_40;
  undefined8 local_38;
  size_type local_30;
  pointer local_28;
  undefined8 local_20;
  
  GetDepfile_abi_cxx11_(&local_d8,this);
  if (local_d8._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    bVar1 = cmsys::SystemTools::FileIsFullPath(&local_d8);
    if (!bVar1) {
      psVar2 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LG);
      local_60.first._M_str = (psVar2->_M_dataplus)._M_p;
      local_60.first._M_len = psVar2->_M_string_length;
      local_60.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_88 = local_80;
      local_98 = 0;
      local_90 = 1;
      local_80[0] = 0x2f;
      local_48 = 1;
      local_38 = 0;
      local_30 = local_d8._M_string_length;
      local_28 = local_d8._M_dataplus._M_p;
      local_20 = 0;
      views._M_len = 3;
      views._M_array = &local_60;
      local_40 = local_88;
      cmCatViews(&local_b8,views);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
    cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,&local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetFullDepfile() const
{
  std::string depfile = this->GetDepfile();
  if (depfile.empty()) {
    return "";
  }

  if (!cmSystemTools::FileIsFullPath(depfile)) {
    depfile = cmStrCat(this->LG->GetCurrentBinaryDirectory(), '/', depfile);
  }
  return cmSystemTools::CollapseFullPath(depfile);
}